

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

void __thiscall wasm::Literal::getBits(Literal *this,uint8_t (*buf) [16])

{
  BasicType BVar1;
  uint8_t (*buf_local) [16];
  Literal *this_local;
  
  *(uint8_t *)((long)buf + 0) = '\0';
  *(uint8_t *)((long)buf + 1) = '\0';
  *(uint8_t *)((long)buf + 2) = '\0';
  *(uint8_t *)((long)buf + 3) = '\0';
  *(uint8_t *)((long)buf + 4) = '\0';
  *(uint8_t *)((long)buf + 5) = '\0';
  *(uint8_t *)((long)buf + 6) = '\0';
  *(uint8_t *)((long)buf + 7) = '\0';
  *(uint8_t *)((long)buf + 8) = '\0';
  *(uint8_t *)((long)buf + 9) = '\0';
  *(uint8_t *)((long)buf + 10) = '\0';
  *(uint8_t *)((long)buf + 0xb) = '\0';
  *(uint8_t *)((long)buf + 0xc) = '\0';
  *(uint8_t *)((long)buf + 0xd) = '\0';
  *(uint8_t *)((long)buf + 0xe) = '\0';
  *(uint8_t *)((long)buf + 0xf) = '\0';
  BVar1 = wasm::Type::getBasic(&this->type);
  switch(BVar1) {
  case none:
  case unreachable:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x1a0);
  case i32:
  case f32:
    *(int32_t *)*buf = (this->field_0).i32;
    break;
  case i64:
  case f64:
    *(int64_t *)*buf = (this->field_0).i64;
    break;
  case v128:
    *(int64_t *)*buf = (this->field_0).i64;
    *(char **)(*buf + 8) = (this->field_0).func.super_IString.str._M_str;
  }
  return;
}

Assistant:

void Literal::getBits(uint8_t (&buf)[16]) const {
  memset(buf, 0, 16);
  switch (type.getBasic()) {
    case Type::i32:
    case Type::f32:
      memcpy(buf, &i32, sizeof(i32));
      break;
    case Type::i64:
    case Type::f64:
      memcpy(buf, &i64, sizeof(i64));
      break;
    case Type::v128:
      memcpy(buf, &v128, sizeof(v128));
      break;
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("invalid type");
  }
}